

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_LoudnessMeter.cpp
# Opt level: O2

int LoudnessMeter::GetFloatBufferCallback
              (UnityAudioEffectState *state,char *name,float *buffer,int numsamples)

{
  uint uVar1;
  int iVar2;
  EffectData *pEVar3;
  bool rms;
  LoudnessAnalyzer *this;
  float windowLength;
  
  pEVar3 = UnityAudioEffectState::GetEffectData<LoudnessMeter::EffectData>(state);
  iVar2 = strcmp(name,"Momentary");
  if (iVar2 == 0) {
    LoudnessAnalyzer::ReadBuffer
              (&pEVar3->momentary,buffer,numsamples,pEVar3->p[0],
               (float)(state->field_0).field_0.samplerate,false);
  }
  iVar2 = strcmp(name,"MomentaryRMS");
  if (iVar2 == 0) {
    this = &pEVar3->momentary;
  }
  else {
    iVar2 = strcmp(name,"ShortTerm");
    if (iVar2 == 0) {
      this = &pEVar3->shortterm;
LAB_00112300:
      windowLength = pEVar3->p[0];
      uVar1 = (state->field_0).field_0.samplerate;
      rms = false;
      goto LAB_00112339;
    }
    iVar2 = strcmp(name,"ShortTermRMS");
    if (iVar2 == 0) {
      this = &pEVar3->shortterm;
    }
    else {
      iVar2 = strcmp(name,"Integrated");
      if (iVar2 == 0) {
        this = &pEVar3->integrated;
        goto LAB_00112300;
      }
      iVar2 = strcmp(name,"IntegratedRMS");
      if (iVar2 != 0) {
        memset(buffer,0,(long)numsamples << 2);
        return 0;
      }
      this = &pEVar3->integrated;
    }
  }
  windowLength = pEVar3->p[0];
  uVar1 = (state->field_0).field_0.samplerate;
  rms = true;
LAB_00112339:
  LoudnessAnalyzer::ReadBuffer(this,buffer,numsamples,windowLength,(float)uVar1,rms);
  return 0;
}

Assistant:

int UNITY_AUDIODSP_CALLBACK GetFloatBufferCallback(UnityAudioEffectState* state, const char* name, float* buffer, int numsamples)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        if (strcmp(name, "Momentary") == 0)
            data->momentary.ReadBuffer(buffer, numsamples, data->p[P_Window], (float)state->samplerate, false);
        if (strcmp(name, "MomentaryRMS") == 0)
            data->momentary.ReadBuffer(buffer, numsamples, data->p[P_Window], (float)state->samplerate, true);
        else if (strcmp(name, "ShortTerm") == 0)
            data->shortterm.ReadBuffer(buffer, numsamples, data->p[P_Window], (float)state->samplerate, false);
        else if (strcmp(name, "ShortTermRMS") == 0)
            data->shortterm.ReadBuffer(buffer, numsamples, data->p[P_Window], (float)state->samplerate, true);
        else if (strcmp(name, "Integrated") == 0)
            data->integrated.ReadBuffer(buffer, numsamples, data->p[P_Window], (float)state->samplerate, false);
        else if (strcmp(name, "IntegratedRMS") == 0)
            data->integrated.ReadBuffer(buffer, numsamples, data->p[P_Window], (float)state->samplerate, true);
        else
            memset(buffer, 0, sizeof(float) * numsamples);
        return UNITY_AUDIODSP_OK;
    }